

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O0

char * status_entry(char *key)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  __ssize_t _Var3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  char *local_38;
  char *v;
  FILE *fp;
  size_t line_n;
  char *line;
  char *result;
  char *key_local;
  
  line = (char *)0x0;
  line_n = 0;
  fp = (FILE *)0x0;
  result = key;
  __stream = fopen("/proc/self/status","r");
  if (__stream != (FILE *)0x0) {
    do {
      do {
        _Var3 = getline((char **)&line_n,(size_t *)&fp,__stream);
        if (_Var3 == -1) goto LAB_00313ceb;
        local_38 = strchr((char *)line_n,0x3a);
      } while ((local_38 == (char *)0x0) || (*local_38 == '\0'));
      *local_38 = '\0';
      iVar2 = strcmp((char *)line_n,result);
    } while (iVar2 != 0);
    do {
      local_38 = local_38 + 1;
      bVar6 = true;
      if (*local_38 != ' ') {
        bVar6 = *local_38 == '\t';
      }
    } while (bVar6);
    sVar4 = strlen(local_38);
    if (1 < sVar4) {
      sVar4 = strlen(local_38);
      local_38[sVar4 - 1] = '\0';
    }
    if (*local_38 != '\0') {
      line = (char *)line_n;
      do {
        cVar1 = *local_38;
        sVar5 = line_n + 1;
        *(char *)line_n = cVar1;
        local_38 = local_38 + 1;
        line_n = sVar5;
      } while (cVar1 != '\0');
    }
  }
LAB_00313ceb:
  if (line == (char *)0x0) {
    free((void *)line_n);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return line;
}

Assistant:

static char *
status_entry(const char *key)
{
	char *result = NULL;
	char *line = NULL;
	size_t line_n = 0;
	FILE *fp;
	fp = fopen("/proc/self/status", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		char *v;
		v = strchr(line, ':');
		if (!v || *v == '\0')
			continue;
		*v = '\0';
		if (strcmp(line, key) != 0)
			continue;
		++v;
		while (*v == ' ' || *v == '\t')
			++v;
		if (strlen(v) > 1)
			v[strlen(v)-1] = '\0';
		if (*v == '\0')
			goto done;
		result = line;
		while ((*line++ = *v++))
			;
		goto done;
	}
done:
	if (!result)
		free(line);
	if (fp)
		fclose(fp);
	return result;
}